

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicUsage::Cleanup(BasicUsage *this)

{
  BasicUsage *this_local;
  
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vsp);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_fsp);
  glu::CallLogWrapper::glDeleteProgramPipelines
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_ppo);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vao);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vbo);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteProgram(m_vsp);
		glDeleteProgram(m_fsp);
		glDeleteProgramPipelines(1, &m_ppo);
		glDeleteVertexArrays(1, &m_vao);
		glDeleteBuffers(1, &m_vbo);
		return NO_ERROR;
	}